

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# virtual_mips.cpp
# Opt level: O0

void __thiscall
vmips::Function::assign_special(Function *this,SpecialReg special,shared_ptr<vmips::VirtReg> *reg)

{
  element_type *peVar1;
  shared_ptr<vmips::VirtReg> local_50;
  shared_ptr<vmips::VirtReg> local_40;
  shared_ptr<vmips::Instruction> local_30;
  shared_ptr<vmips::VirtReg> *local_20;
  shared_ptr<vmips::VirtReg> *reg_local;
  Function *pFStack_10;
  SpecialReg special_local;
  Function *this_local;
  
  local_20 = reg;
  reg_local._4_4_ = special;
  pFStack_10 = this;
  peVar1 = std::__shared_ptr_access<vmips::CFGNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<vmips::CFGNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)&this->cursor);
  get_special((vmips *)&local_50,reg_local._4_4_);
  std::make_shared<vmips::move,std::shared_ptr<vmips::VirtReg>,std::shared_ptr<vmips::VirtReg>>
            (&local_40,&local_50);
  std::shared_ptr<vmips::Instruction>::shared_ptr<vmips::move,void>
            (&local_30,(shared_ptr<vmips::move> *)&local_40);
  std::
  vector<std::shared_ptr<vmips::Instruction>,_std::allocator<std::shared_ptr<vmips::Instruction>_>_>
  ::push_back(&peVar1->instructions,&local_30);
  std::shared_ptr<vmips::Instruction>::~shared_ptr(&local_30);
  std::shared_ptr<vmips::move>::~shared_ptr((shared_ptr<vmips::move> *)&local_40);
  std::shared_ptr<vmips::VirtReg>::~shared_ptr(&local_50);
  return;
}

Assistant:

void Function::assign_special(SpecialReg special, std::shared_ptr<VirtReg> reg) {
    cursor->instructions.push_back(std::make_shared<move>(get_special(special), std::move(reg)));
}